

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * s2b(char *s,int nd0,int nd,ULong y9,int dplen)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bigint *b;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  
  iVar6 = 0;
  if (9 < nd) {
    iVar2 = (nd + 8) / 9;
    iVar6 = 0;
    iVar5 = 1;
    do {
      iVar4 = iVar5 * 2;
      iVar6 = iVar6 + 1;
      iVar3 = iVar5 * -2;
      iVar5 = iVar4;
    } while (iVar2 != iVar4 && SBORROW4(iVar2,iVar4) == iVar2 + iVar3 < 0);
  }
  b = Balloc(iVar6);
  b->x[0] = y9;
  b->wds = 1;
  if (nd0 < 10) {
    pcVar7 = s + (long)dplen + 9;
    nd0 = 9;
  }
  else {
    pcVar7 = s + 9;
    iVar6 = nd0 + -9;
    do {
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
      b = multadd(b,10,cVar1 + -0x30);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    pcVar7 = pcVar7 + dplen;
  }
  if (nd0 < nd) {
    lVar8 = 0;
    do {
      b = multadd(b,10,pcVar7[lVar8] + -0x30);
      lVar8 = lVar8 + 1;
    } while (nd - nd0 != (int)lVar8);
  }
  return b;
}

Assistant:

static Bigint *
s2b(const char *s, int nd0, int nd, ULong y9, int dplen MTd)
{
	Bigint *b;
	int i, k;
	Long x, y;

	x = (nd + 8) / 9;
	for(k = 0, y = 1; x > y; y <<= 1, k++) ;
#ifdef Pack_32
	b = Balloc(k MTa);
	b->x[0] = y9;
	b->wds = 1;
#else
	b = Balloc(k+1 MTa);
	b->x[0] = y9 & 0xffff;
	b->wds = (b->x[1] = y9 >> 16) ? 2 : 1;
#endif

	i = 9;
	if (9 < nd0) {
		s += 9;
		do b = multadd(b, 10, *s++ - '0' MTa);
			while(++i < nd0);
		s += dplen;
		}
	else
		s += dplen + 9;
	for(; i < nd; i++)
		b = multadd(b, 10, *s++ - '0' MTa);
	return b;
	}